

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  uint *puVar1;
  ulong *puVar2;
  ushort *puVar3;
  int32_t *piVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint64_t uVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  code *m_00;
  long lVar21;
  code *pcVar22;
  ulong unaff_RBP;
  uint uVar23;
  secp256k1_modinv32_modinfo *modinfo;
  ulong uVar24;
  secp256k1_modinv64_modinfo *psVar25;
  secp256k1_modinv64_modinfo *out_00;
  secp256k1_modinv64_modinfo *a;
  secp256k1_modinv64_signed62 *psVar26;
  secp256k1_modinv64_signed62 *psVar27;
  uint16_t *puVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int32_t iVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  code *unaff_R13;
  undefined8 uVar36;
  int iVar37;
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_284;
  secp256k1_modinv32_trans2x2 sStack_278;
  undefined8 uStack_268;
  secp256k1_modinv32_signed30 sStack_260;
  int iStack_234;
  secp256k1_modinv32_signed30 sStack_230;
  code *pcStack_208;
  ulong uStack_200;
  undefined8 uStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_signed62 sStack_1d0;
  uint uStack_1a4;
  secp256k1_modinv64_modinfo sStack_1a0;
  uint16_t auStack_170 [20];
  code *pcStack_148;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  undefined8 uStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv32_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar25 = &local_e8;
  a = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((in[uVar14 >> 4] >> (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  uVar34 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  uVar29 = (ulong)uVar34;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  local_b8.modulus.v[5] = 0;
  local_b8.modulus.v[6] = 0;
  local_b8.modulus.v[7] = 0;
  local_b8.modulus.v[8] = 0;
  uVar14 = 0;
  do {
    modinfo = (secp256k1_modinv32_modinfo *)((ulong)uVar14 / 0x1e);
    piVar4 = local_b8.modulus.v + (long)modinfo;
    *piVar4 = *piVar4 | (uint)((mod[uVar14 >> 4] >> (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  out_00 = (secp256k1_modinv64_modinfo *)(long)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x1613b2;
  uVar17 = modinv2p64((uint64_t)out_00);
  local_b8.modulus_inv30 = (uint)uVar17 & 0x3fffffff;
  puVar28 = mod;
  if (((uint)uVar17 * local_b8.modulus.v[0] & 0x3fffffff) != 1) goto LAB_0016175f;
  if (uVar34 == 0) {
LAB_00161503:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar14 = 0;
    do {
      puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
      *puVar1 = *puVar1 | (uint)((in[uVar14 >> 4] >> (uVar14 & 0xf) & 1) != 0) <<
                          ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0x100);
    iVar15 = 0x10;
    do {
      uVar29 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3d;
      iVar35 = local_b8.modulus.v[uVar29];
      if ((iVar35 < 1) || (iVar20 = local_b8.modulus.v[uVar29 + 1], 0x3fffffff < iVar20)) {
        if ((iVar35 < 0) && (iVar20 = local_b8.modulus.v[uVar29 + 1], 0x3ffffffe < iVar20)) {
          local_b8.modulus.v[uVar29] = iVar35 + 0x40000000;
          iVar32 = iVar20 + -1;
          goto LAB_001615d4;
        }
      }
      else {
        local_b8.modulus.v[uVar29] = iVar35 + -0x40000000;
        iVar32 = iVar20 + 1;
LAB_001615d4:
        local_b8.modulus.v[uVar29 + 1] = iVar32;
      }
      uVar30 = secp256k1_test_state[1] << 0x11;
      uVar24 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar29 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar24;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar29;
      secp256k1_test_state[2] = uVar24 ^ uVar30;
      secp256k1_test_state[3] = uVar29 << 0x2d | uVar29 >> 0x13;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    unaff_RBP = (ulong)(uVar34 != 0);
    puVar28 = (uint16_t *)0x0;
    uVar29 = 0x88888889;
    local_88.modulus_inv62 = (uint64_t)mod;
    while( true ) {
      iVar15 = (int)puVar28;
      unaff_R13 = secp256k1_modinv32_var;
      if (iVar15 == 0) {
        unaff_R13 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x16164b;
      (*unaff_R13)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar14 = 0;
      do {
        out[uVar14 >> 4] =
             out[uVar14 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4) >>
                       uVar14 % 0x1e & 1) != 0) << ((byte)uVar14 & 0xf);
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x100);
      out_00 = &local_88;
      pcStack_f0 = (code *)0x1616a6;
      modinfo = (secp256k1_modinv32_modinfo *)out;
      mulmod256((uint16_t *)out_00,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar34 != 0)) break;
      lVar18 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar18 * 2) != 0) {
          pcStack_f0 = (code *)0x161755;
          test_modinv32_uint16_cold_4();
          goto LAB_00161755;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      pcStack_f0 = (code *)0x1616d6;
      out_00 = &local_e8;
      (*unaff_R13)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar14 = 0;
      do {
        uVar23 = (uint)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4) >>
                         uVar14 % 0x1e & 1) != 0) << ((byte)uVar14 & 0xf);
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar23;
        puVar3 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar14 >> 4) * 2);
        *puVar3 = *puVar3 | (ushort)uVar23;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x100);
      lVar18 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar18 * 2) != in[lVar18]) goto LAB_00161755;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      puVar28 = (uint16_t *)(ulong)(iVar15 + 1);
      if (iVar15 != 0) {
        return;
      }
    }
    goto LAB_0016175a;
  }
  pcStack_f0 = (code *)0x1613eb;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar14 >> 4) * 2) >>
                                (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16144e;
  uVar14 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if (1 < uVar14) goto LAB_00161764;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x161487;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar14 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar14 / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar14 >> 4) * 2) >>
                                (uVar14 & 0xf) & 1) != 0) <<
                        ((char)(uVar14 / 0x1e) * -0x1e + (char)uVar14 & 0x1fU);
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x1614ea;
  iVar15 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if ((iVar15 == 0) || (iVar15 == 1 - (*mod & 2))) goto LAB_00161503;
LAB_00161769:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = unaff_R13;
  uStack_110 = uVar29;
  puStack_118 = puVar28;
  psVar26 = &sStack_1d0;
  psVar27 = &sStack_1d0;
  sStack_1d0.v[0] = 0;
  sStack_1d0.v[1] = 0;
  sStack_1d0.v[2] = 0;
  sStack_1d0.v[3] = 0;
  sStack_1d0.v[4] = 0;
  uVar29 = 0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar29 >> 1;
    puVar2 = (ulong *)((long)sStack_1d0.v +
                      (ulong)((uint)((uVar29 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar2 = *puVar2 | (ulong)((*(ushort *)
                                  ((long)(modinfo->modulus).v + (uVar29 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar29 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar29 & 0x3fU);
    uVar29 = uVar29 + 1;
  } while ((int)uVar29 != 0x100);
  uVar29 = sStack_1d0.v[1] | sStack_1d0.v[0] | sStack_1d0.v[2] | sStack_1d0.v[3] | sStack_1d0.v[4];
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar25 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)psVar25 >> 1;
    puVar2 = (ulong *)((long)sStack_1a0.modulus.v +
                      (ulong)((uint)(((ulong)psVar25 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                             0xfffffff8));
    *puVar2 = *puVar2 | (ulong)((*(ushort *)(m_00 + ((ulong)psVar25 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)psVar25 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar25 & 0x3fU);
    psVar25 = (secp256k1_modinv64_modinfo *)((long)(psVar25->modulus).v + 1);
  } while ((int)psVar25 != 0x100);
  uVar36 = 0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x16189b;
  puVar28 = (uint16_t *)sStack_1a0.modulus.v[0];
  uVar17 = modinv2p64(sStack_1a0.modulus.v[0]);
  sStack_1a0.modulus_inv62 = uVar17 & 0x3fffffffffffffff;
  pcVar22 = m_00;
  if ((uVar17 * sStack_1a0.modulus.v[0] & 0x3fffffffffffffff) == 1) {
    if (uVar29 == 0) {
LAB_00161a1d:
      pcStack_148 = m_00;
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar24 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar24 >> 1;
        puVar2 = (ulong *)((long)sStack_1d0.v +
                          (ulong)((uint)((uVar24 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                 0xfffffff8));
        *puVar2 = *puVar2 | (ulong)((*(ushort *)
                                      ((long)(modinfo->modulus).v + (uVar24 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar24 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar24 & 0x3fU);
        uVar24 = uVar24 + 1;
      } while ((int)uVar24 != 0x100);
      iVar15 = 8;
      do {
        uVar24 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0] >> 0x3e;
        lVar18 = sStack_1a0.modulus.v[uVar24];
        if ((lVar18 < 1) || (lVar21 = sStack_1a0.modulus.v[uVar24 + 1], 0x3fffffffffffffff < lVar21)
           ) {
          if ((lVar18 < 0) &&
             (lVar21 = sStack_1a0.modulus.v[uVar24 + 1], -0x4000000000000000 < lVar21)) {
            sStack_1a0.modulus.v[uVar24] = lVar18 + 0x4000000000000000;
            lVar21 = lVar21 + -1;
            goto LAB_00161b10;
          }
        }
        else {
          sStack_1a0.modulus.v[uVar24] = lVar18 + -0x4000000000000000;
          lVar21 = lVar21 + 1;
LAB_00161b10:
          sStack_1a0.modulus.v[uVar24 + 1] = lVar21;
        }
        uVar33 = secp256k1_test_state[1] << 0x11;
        uVar30 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar24 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar30;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar24;
        secp256k1_test_state[2] = uVar30 ^ uVar33;
        secp256k1_test_state[3] = uVar24 << 0x2d | uVar24 >> 0x13;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
      uStack_1a4 = (uint)(uVar29 != 0);
      uVar29 = 0;
      uVar36 = 0x84210843;
      while( true ) {
        iVar15 = (int)uVar29;
        pcVar22 = secp256k1_modinv64_var;
        if (iVar15 == 0) {
          pcVar22 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x161b85;
        (*pcVar22)(&sStack_1d0);
        (a->modulus).v[2] = 0;
        (a->modulus).v[3] = 0;
        (a->modulus).v[0] = 0;
        (a->modulus).v[1] = 0;
        uVar24 = 0;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar24 >> 1;
          puVar3 = (ushort *)((long)(a->modulus).v + (uVar24 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)((*(ulong *)((long)sStack_1d0.v +
                                                  (ulong)((uint)((uVar24 >> 1 & 0x7fffffff) *
                                                                 0x84210843 >> 0x21) & 0xfffffff8))
                                        >> ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar24) & 0x3f) & 1) != 0) <<
                              ((byte)uVar24 & 0xf);
          uVar24 = uVar24 + 1;
        } while ((int)uVar24 != 0x100);
        puVar28 = auStack_170;
        pcStack_1d8 = (code *)0x161bf5;
        psVar25 = a;
        mulmod256(puVar28,(uint16_t *)a,(uint16_t *)modinfo,(uint16_t *)pcStack_148);
        if (auStack_170[0] != (uint16_t)uStack_1a4) break;
        lVar18 = 1;
        do {
          if (auStack_170[lVar18] != 0) {
            pcStack_1d8 = (code *)0x161cc0;
            test_modinv64_uint16_cold_4();
            goto LAB_00161cc0;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        pcStack_1d8 = (code *)0x161c28;
        (*pcVar22)(&sStack_1d0);
        auStack_170[8] = 0;
        auStack_170[9] = 0;
        auStack_170[10] = 0;
        auStack_170[0xb] = 0;
        auStack_170[0xc] = 0;
        auStack_170[0xd] = 0;
        auStack_170[0xe] = 0;
        auStack_170[0xf] = 0;
        auStack_170[0] = 0;
        auStack_170[1] = 0;
        auStack_170[2] = 0;
        auStack_170[3] = 0;
        auStack_170[4] = 0;
        auStack_170[5] = 0;
        auStack_170[6] = 0;
        auStack_170[7] = 0;
        psVar25 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = (ulong)psVar25 >> 1;
          puVar28 = (uint16_t *)
                    ((ulong)((*(ulong *)((long)sStack_1d0.v +
                                        (ulong)((uint)(((ulong)psVar25 >> 1 & 0x7fffffff) *
                                                       0x84210843 >> 0x21) & 0xfffffff8)) >>
                              ((ulong)((SUB164(auVar12 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                      (int)psVar25) & 0x3f) & 1) != 0) << ((byte)psVar25 & 0xf));
          auStack_170[(ulong)psVar25 >> 4 & 0xfffffff] =
               auStack_170[(ulong)psVar25 >> 4 & 0xfffffff] | (ushort)puVar28;
          psVar25 = (secp256k1_modinv64_modinfo *)((long)(psVar25->modulus).v + 1);
        } while ((int)psVar25 != 0x100);
        lVar18 = 0;
        do {
          if (auStack_170[lVar18] != *(uint16_t *)((long)(modinfo->modulus).v + lVar18 * 2))
          goto LAB_00161cc0;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        uVar29 = (ulong)(iVar15 + 1);
        if (iVar15 != 0) {
          return;
        }
      }
LAB_00161cc5:
      pcStack_1d8 = (code *)0x161cca;
      test_modinv64_uint16_cold_3();
      goto LAB_00161cca;
    }
    pcStack_1d8 = (code *)0x1618d5;
    mulmod256(auStack_170,(uint16_t *)modinfo,(uint16_t *)modinfo,(uint16_t *)m_00);
    sStack_1d0.v[2] = 0;
    sStack_1d0.v[3] = 0;
    sStack_1d0.v[0] = 0;
    sStack_1d0.v[1] = 0;
    sStack_1d0.v[4] = 0;
    uVar24 = 0;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar24 >> 1;
      puVar2 = (ulong *)((long)sStack_1d0.v +
                        (ulong)((uint)((uVar24 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar2 = *puVar2 | (ulong)((auStack_170[uVar24 >> 4 & 0xfffffff] >> ((uint)uVar24 & 0xf) & 1)
                                 != 0) <<
                          ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar24 & 0x3fU);
      uVar24 = uVar24 + 1;
    } while ((int)uVar24 != 0x100);
    psVar25 = &sStack_1a0;
    pcStack_1d8 = (code *)0x161950;
    uVar14 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar25);
    if (uVar14 < 2) {
      uStack_140 = *(uint16_t *)m_00 - 1;
      uStack_13e = *(undefined8 *)(m_00 + 2);
      uStack_128 = *(undefined8 *)(m_00 + 0x18);
      uStack_136 = (undefined6)*(undefined8 *)(m_00 + 10);
      uStack_130 = (undefined2)*(undefined8 *)(m_00 + 0x10);
      uStack_12e = (undefined6)((ulong)*(undefined8 *)(m_00 + 0x10) >> 0x10);
      pcStack_1d8 = (code *)0x161989;
      mulmod256(auStack_170,auStack_170,&uStack_140,(uint16_t *)m_00);
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar24 = 0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar24 >> 1;
        puVar2 = (ulong *)((long)sStack_1d0.v +
                          (ulong)((uint)((uVar24 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                 0xfffffff8));
        *puVar2 = *puVar2 | (ulong)((auStack_170[uVar24 >> 4 & 0xfffffff] >> ((uint)uVar24 & 0xf) &
                                    1) != 0) <<
                            ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar24 & 0x3fU);
        uVar24 = uVar24 + 1;
      } while ((int)uVar24 != 0x100);
      psVar25 = &sStack_1a0;
      pcStack_1d8 = (code *)0x161a04;
      iVar15 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar25);
      if ((iVar15 != 0) && (iVar15 != 1 - (*(ushort *)m_00 & 2))) goto LAB_00161cd4;
      goto LAB_00161a1d;
    }
  }
  else {
LAB_00161cca:
    pcStack_1d8 = (code *)0x161ccf;
    test_modinv64_uint16_cold_1();
    psVar26 = (secp256k1_modinv64_signed62 *)puVar28;
  }
  psVar27 = psVar26;
  pcStack_1d8 = (code *)0x161cd4;
  test_modinv64_uint16_cold_6();
LAB_00161cd4:
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar27 & 1) != 0) {
    iVar15 = 6;
    do {
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = a;
  psStack_1f0 = modinfo;
  uStack_1f8 = uVar36;
  uStack_200 = uVar29;
  pcStack_208 = pcVar22;
  sStack_260.v[8] = (int32_t)(psVar25->modulus).v[4];
  sStack_260.v._16_8_ = (psVar25->modulus).v[2];
  sStack_260.v._24_8_ = (psVar25->modulus).v[3];
  sStack_260.v._0_8_ = (psVar25->modulus).v[0];
  sStack_260.v._8_8_ = (psVar25->modulus).v[1];
  sStack_230.v[8] = *(int32_t *)((long)psVar27 + 0x20);
  sStack_230.v._0_8_ = psVar27->v[0];
  sStack_230.v._8_8_ = *(undefined8 *)((long)psVar27 + 8);
  sStack_230.v._16_8_ = *(undefined8 *)((long)psVar27 + 0x10);
  sStack_230.v._24_8_ = *(undefined8 *)((long)psVar27 + 0x18);
  uVar29 = 9;
  iVar35 = -1;
  iVar15 = 0;
  do {
    iVar20 = 0;
    if ((sStack_230.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_230.v[0] | 0xc0000000U) >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
      }
    }
    sStack_278.u = 1 << ((byte)iVar20 & 0x1f);
    iVar35 = iVar35 - iVar20;
    if (iVar20 == 0x1e) {
      iStack_284 = 1;
      sStack_278.q = 0;
      sStack_278.v = 0;
    }
    else {
      uVar14 = sStack_260.v[1] << 0x1e | sStack_260.v[0];
      uVar34 = (uint)(sStack_230.v[1] << 0x1e | sStack_230.v[0]) >> ((byte)iVar20 & 0x1f);
      iVar20 = 0x1e - iVar20;
      iStack_284 = 1;
      sStack_278.v = 0;
      sStack_278.q = 0;
      do {
        iVar37 = sStack_278.u;
        uVar23 = uVar34;
        iVar31 = sStack_278.v;
        if (iVar35 < 0) {
          iVar35 = -iVar35;
          iVar37 = sStack_278.q;
          uVar23 = uVar14;
          uVar14 = uVar34;
          sStack_278.q = sStack_278.u;
          iVar31 = iStack_284;
          iStack_284 = sStack_278.v;
        }
        iVar5 = iVar35 + 1;
        if (iVar20 <= iVar35 + 1) {
          iVar5 = iVar20;
        }
        uVar16 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar14 >> 1 & 0x7f] * (char)uVar23) <<
                 (-(char)iVar5 & 0x1fU)) >> (-(char)iVar5 & 0x1fU);
        uVar23 = uVar16 * uVar14 + uVar23;
        sStack_278.q = uVar16 * iVar37 + sStack_278.q;
        uVar34 = -1 << ((byte)iVar20 & 0x1f) | uVar23;
        iVar5 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        bVar19 = (byte)iVar5;
        uVar34 = uVar23 >> (bVar19 & 0x1f);
        sStack_278.u = iVar37 << (bVar19 & 0x1f);
        sStack_278.v = iVar31 << (bVar19 & 0x1f);
        iStack_284 = uVar16 * iVar31 + iStack_284;
        iVar35 = iVar35 - iVar5;
        iVar20 = iVar20 - iVar5;
      } while (iVar20 != 0);
    }
    uVar14 = (uint)uVar29;
    sStack_278.r = iStack_284;
    uStack_268 = uVar29;
    secp256k1_modinv32_update_fg_30_var(uVar14,&sStack_260,&sStack_230,&sStack_278);
    if (sStack_260.v[0] == 1) {
      if (1 < (int)uVar14) {
        uVar34 = 0;
        uVar24 = 1;
        do {
          uVar34 = uVar34 | sStack_260.v[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar29 != uVar24);
        if (uVar34 != 0) goto LAB_00161ee9;
      }
      bVar13 = false;
    }
    else {
LAB_00161ee9:
      uVar34 = uVar14 - 1;
      if (((int)(uVar14 - 2) < 0 || *(int *)((long)&uStack_268 + (long)(int)uVar14 * 4 + 4) != 0) ||
          (&iStack_234)[(int)uVar14] != 0) {
        uVar34 = uVar14;
      }
      bVar13 = true;
      uVar29 = (ulong)uVar34;
    }
    if ((!bVar13) || (iVar15 = iVar15 + 1, iVar15 == 0x32)) {
      return;
    }
  } while( true );
LAB_00161755:
  pcStack_f0 = (code *)0x16175a;
  test_modinv32_uint16_cold_5();
LAB_0016175a:
  pcStack_f0 = (code *)0x16175f;
  test_modinv32_uint16_cold_3();
LAB_0016175f:
  pcStack_f0 = (code *)0x161764;
  test_modinv32_uint16_cold_1();
  psVar25 = out_00;
LAB_00161764:
  a = psVar25;
  pcStack_f0 = (code *)0x161769;
  test_modinv32_uint16_cold_6();
  goto LAB_00161769;
LAB_00161cc0:
  pcStack_1d8 = (code *)0x161cc5;
  test_modinv64_uint16_cold_5();
  goto LAB_00161cc5;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}